

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O1

void __thiscall nv::BlockDXT5::flip4(BlockDXT5 *this)

{
  ushort *puVar1;
  uint8 uVar2;
  ulong uVar3;
  
  uVar3 = (this->alpha).field_0.u;
  (this->alpha).field_0.u =
       uVar3 >> 0x24 & 0xfff0000 |
       uVar3 >> 0xc & 0xfff0000000 |
       (uVar3 & 0xfff0000000) << 0xc | (uVar3 & 0xfff0000) << 0x24 | uVar3 & 0xffff;
  uVar2 = (this->color).field_2.row[0];
  (this->color).field_2.row[0] = (this->color).field_2.row[3];
  (this->color).field_2.row[3] = uVar2;
  puVar1 = (ushort *)((long)&(this->color).field_2 + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  return;
}

Assistant:

void AlphaBlockDXT5::flip4()
{
	uint64 * b = (uint64 *)this;
	
	// @@ The masks might have to be byte swapped.
	uint64 tmp = (*b & POSH_U64(0x000000000000FFFF));
	tmp |= (*b & POSH_U64(0x000000000FFF0000)) << 36;
	tmp |= (*b & POSH_U64(0x000000FFF0000000)) << 12;
	tmp |= (*b & POSH_U64(0x000FFF0000000000)) >> 12;
	tmp |= (*b & POSH_U64(0xFFF0000000000000)) >> 36;
	
	*b = tmp;
}